

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O2

int SUNLinSolSetup_Dense(SUNLinearSolver S,SUNMatrix A)

{
  sunindextype *p;
  int iVar1;
  realtype **a;
  sunindextype sVar2;
  sunindextype n;
  
  if (S != (SUNLinearSolver)0x0 && A != (SUNMatrix)0x0) {
    iVar1 = SUNMatGetID(A);
    if (iVar1 == 0) {
      a = (realtype **)SUNDenseMatrix_Cols(A);
      p = *(sunindextype **)((long)S->content + 8);
      if (p == (sunindextype *)0x0 || a == (realtype **)0x0) {
        *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffd;
        iVar1 = -3;
      }
      else {
        sVar2 = SUNDenseMatrix_Rows(A);
        n = SUNDenseMatrix_Columns(A);
        sVar2 = denseGETRF(a,sVar2,n,p);
        *(sunindextype *)((long)S->content + 0x10) = sVar2;
        iVar1 = (uint)(0 < sVar2) << 3;
      }
    }
    else {
      *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffe;
      iVar1 = -2;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int SUNLinSolSetup_Dense(SUNLinearSolver S, SUNMatrix A)
{
  realtype **A_cols;
  sunindextype *pivots;
  
  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) ) 
    return(SUNLS_MEM_NULL);
  
  /* Ensure that A is a dense matrix */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE) {
    LASTFLAG(S) = SUNLS_ILL_INPUT;
    return(LASTFLAG(S));
  }
  
  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }
  
  /* perform LU factorization of input matrix */
  LASTFLAG(S) = denseGETRF(A_cols, SUNDenseMatrix_Rows(A),
                           SUNDenseMatrix_Columns(A), pivots);

  /* store error flag (if nonzero, this row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0)
    return(SUNLS_LUFACT_FAIL);
  return(SUNLS_SUCCESS);
}